

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

interval_t __thiscall
duckdb::NegateOperator::Operation<duckdb::interval_t,duckdb::interval_t>
          (NegateOperator *this,interval_t input)

{
  OutOfRangeException *pOVar1;
  long lVar2;
  interval_t iVar3;
  string local_40;
  
  lVar2 = input._0_8_;
  if ((int)((ulong)this >> 0x20) == -0x80000000) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10,lVar2,input.micros);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Overflow in negation of integer!","");
    OutOfRangeException::OutOfRangeException(pOVar1,&local_40);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (lVar2 == -0x8000000000000000) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10,0x8000000000000000,input.micros);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Overflow in negation of integer!","");
    OutOfRangeException::OutOfRangeException(pOVar1,&local_40);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar3._0_8_ = (ulong)(uint)-(int)this - ((ulong)this & 0xffffffff00000000);
  iVar3.micros = -lVar2;
  return iVar3;
}

Assistant:

static bool CanNegate(T input) {
		using Limits = NumericLimits<T>;
		return !(Limits::IsSigned() && Limits::Minimum() == input);
	}